

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O0

XSerializable * xercesc_4_0::DateTimeValidator::createObject(MemoryManager *param_1)

{
  MemoryManager *param_0_local;
  
  return (XSerializable *)0x0;
}

Assistant:

void DateTimeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     *
     * Note: All its derivatives share the same number type, that is
     *       XMLNumber::DateTime, so this class would write it.
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) XMLNumber::DateTime;
    }

    AbstractNumericFacetValidator::serialize(serEng);

    //dateTime can be instantiated during checkContent(), so don't serialize it.
}